

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::readBufferTextureWithMappingAndVerify
               (RenderContext *renderCtx,CallLogWrapper *glLog,deUint32 bufferGL,
               TextureFormat *textureFormat,int imageSize,ImageLayerVerifier *verifyLayer)

{
  void **this;
  int iVar1;
  TestLog *pTVar2;
  undefined4 extraout_var;
  void *dst;
  void *src;
  undefined1 local_108 [8];
  BufferMemMap bufMap;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  ScopedLogSection local_a0;
  ScopedLogSection section;
  int dataSize;
  undefined1 local_88 [8];
  PixelBufferAccess resultAccess;
  TextureLevel result;
  ImageLayerVerifier *verifyLayer_local;
  int imageSize_local;
  TextureFormat *textureFormat_local;
  deUint32 bufferGL_local;
  CallLogWrapper *glLog_local;
  RenderContext *renderCtx_local;
  
  this = &resultAccess.super_ConstPixelBufferAccess.m_data;
  tcu::TextureLevel::TextureLevel((TextureLevel *)this,textureFormat,imageSize,1,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_88,(TextureLevel *)this);
  iVar1 = tcu::TextureFormat::getPixelSize(textureFormat);
  section.m_log._0_4_ = imageSize * iVar1;
  pTVar2 = glu::CallLogWrapper::getLog(glLog);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"Verification",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Result verification (read texture\'s buffer with a mapping)",
             (allocator<char> *)((long)&bufMap.m_ptr + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_a0,pTVar2,&local_c0,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&bufMap.m_ptr + 7));
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  glu::CallLogWrapper::glBindBuffer(glLog,0x8c2a,bufferGL);
  iVar1 = (*renderCtx->_vptr_RenderContext[3])();
  BufferMemMap::BufferMemMap
            ((BufferMemMap *)local_108,(Functions *)CONCAT44(extraout_var,iVar1),0x8c2a,0,
             (int)section.m_log,1);
  dst = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_88);
  src = BufferMemMap::getPtr((BufferMemMap *)local_108);
  ::deMemcpy(dst,src,(long)(int)section.m_log);
  BufferMemMap::~BufferMemMap((BufferMemMap *)local_108);
  pTVar2 = glu::CallLogWrapper::getLog(glLog);
  iVar1 = (**verifyLayer->_vptr_ImageLayerVerifier)(verifyLayer,pTVar2,local_88,0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_a0);
  tcu::TextureLevel::~TextureLevel
            ((TextureLevel *)&resultAccess.super_ConstPixelBufferAccess.m_data);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

static bool readBufferTextureWithMappingAndVerify (const RenderContext&			renderCtx,
												   glu::CallLogWrapper&			glLog,
												   deUint32						bufferGL,
												   const TextureFormat&			textureFormat,
												   int							imageSize,
												   const ImageLayerVerifier&	verifyLayer)
{
	tcu::TextureLevel			result			(textureFormat, imageSize, 1);
	const PixelBufferAccess		resultAccess	= result.getAccess();
	const int					dataSize		= imageSize * textureFormat.getPixelSize();

	const tcu::ScopedLogSection section(glLog.getLog(), "Verification", "Result verification (read texture's buffer with a mapping)");
	glLog.glBindBuffer(GL_TEXTURE_BUFFER, bufferGL);

	{
		const BufferMemMap bufMap(renderCtx.getFunctions(), GL_TEXTURE_BUFFER, 0, dataSize, GL_MAP_READ_BIT);
		deMemcpy(resultAccess.getDataPtr(), bufMap.getPtr(), dataSize);
	}

	return verifyLayer(glLog.getLog(), resultAccess, 0);
}